

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcOpAlg.c
# Opt level: O1

Mvc_Cover_t * Mvc_CoverAlgebraicSubtract(Mvc_Cover_t *pCover1,Mvc_Cover_t *pCover2)

{
  int *piVar1;
  Mvc_Cover_t *pCover;
  Mvc_Cube_t *pMVar2;
  Mvc_Cube_t *pMVar3;
  uint uVar4;
  uint uVar5;
  Mvc_List_t *pList;
  Mvc_Cube_t *pCube;
  bool bVar6;
  
  if (pCover1->nBits != pCover2->nBits) {
    __assert_fail("pCover1->nBits == pCover2->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcOpAlg.c"
                  ,0x60,"Mvc_Cover_t *Mvc_CoverAlgebraicSubtract(Mvc_Cover_t *, Mvc_Cover_t *)");
  }
  pCover = Mvc_CoverClone(pCover1);
  pCube = (pCover1->lCubes).pHead;
  if (pCube != (Mvc_Cube_t *)0x0) {
    do {
      pMVar2 = (pCover2->lCubes).pHead;
      if (pMVar2 != (Mvc_Cube_t *)0x0) {
        uVar4 = *(uint *)&pCube->field_0x8 & 0xffffff;
        do {
          if (uVar4 == 0) {
            bVar6 = pCube->pData[0] == pMVar2->pData[0];
LAB_0040c094:
            if (bVar6) goto LAB_0040c0ce;
          }
          else {
            uVar5 = uVar4;
            if (uVar4 == 1) {
              if (pCube->pData[0] == pMVar2->pData[0]) {
                bVar6 = *(int *)&pCube->field_0x14 == *(int *)&pMVar2->field_0x14;
                goto LAB_0040c094;
              }
            }
            else {
              while (pCube->pData[uVar5] == pMVar2->pData[uVar5]) {
                bVar6 = (int)uVar5 < 1;
                uVar5 = uVar5 - 1;
                if (bVar6) goto LAB_0040c0ce;
              }
            }
          }
          pMVar2 = pMVar2->pNext;
        } while (pMVar2 != (Mvc_Cube_t *)0x0);
      }
      pMVar3 = Mvc_CubeDup(pCover,pCube);
      pMVar2 = (Mvc_Cube_t *)&pCover->lCubes;
      if ((pCover->lCubes).pHead != (Mvc_Cube_t *)0x0) {
        pMVar2 = (pCover->lCubes).pTail;
      }
      pMVar2->pNext = pMVar3;
      (pCover->lCubes).pTail = pMVar3;
      pMVar3->pNext = (Mvc_Cube_t *)0x0;
      piVar1 = &(pCover->lCubes).nItems;
      *piVar1 = *piVar1 + 1;
LAB_0040c0ce:
      pCube = pCube->pNext;
    } while (pCube != (Mvc_Cube_t *)0x0);
  }
  return pCover;
}

Assistant:

Mvc_Cover_t * Mvc_CoverAlgebraicSubtract( Mvc_Cover_t * pCover1, Mvc_Cover_t * pCover2 )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube1, * pCube2, * pCube;
    int fFound;
    int CompResult;

    // covers should be the same base
    assert( pCover1->nBits == pCover2->nBits );

    // iterate through the cubes
    pCover = Mvc_CoverClone( pCover1 );
    Mvc_CoverForEachCube( pCover1, pCube1 )
    {
        fFound = 0;
        Mvc_CoverForEachCube( pCover2, pCube2 )
        {
            Mvc_CubeBitEqual( CompResult, pCube1, pCube2 );
            if ( CompResult )
            {
                fFound = 1;
                break;
            }
        }
        if ( !fFound )
        { 
            // create the copy of the cube
            pCube = Mvc_CubeDup( pCover, pCube1 );
            // add the cube copy to the cover
            Mvc_CoverAddCubeTail( pCover, pCube );
        }
    }
    return pCover;
}